

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  LogMessage *other;
  LogMessage local_f0;
  ZeroCopyInputStream local_b8;
  ZeroCopyCodedInputStream zcis;
  ParseContext ctx;
  CodedInputStream *ptr;
  
  local_b8._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_0019e6e0;
  ctx.super_EpsCopyInputStream.last_tag_minus_1_ = input->recursion_budget_;
  ctx.super_EpsCopyInputStream.buffer_._24_8_ = ZEXT18(input->aliasing_enabled_);
  ctx.super_EpsCopyInputStream.buffer_[0] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[1] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[2] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[3] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[4] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[5] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[6] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[7] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[8] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[9] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xb] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xc] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xd] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xe] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xf] = '\0';
  ctx.super_EpsCopyInputStream.size_ = 0;
  ctx.super_EpsCopyInputStream.limit_ = 0;
  ctx.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
  ctx.super_EpsCopyInputStream.buffer_[0x10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x11] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x12] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x13] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x14] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x15] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x16] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x17] = '\0';
  ctx.super_EpsCopyInputStream.aliasing_ = 0x7fffffff00000000;
  ctx.super_EpsCopyInputStream.overall_limit_ = -0x80000000;
  ctx.depth_ = 0;
  ctx.group_depth_ = 0;
  ctx.data_.pool = (DescriptorPool *)0x0;
  zcis.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)input;
  pcVar2 = internal::EpsCopyInputStream::InitFrom((EpsCopyInputStream *)&zcis.cis_,&local_b8);
  ctx.super_EpsCopyInputStream.overall_limit_ = 0;
  ctx._88_8_ = input->extension_pool_;
  ctx.data_.pool = (DescriptorPool *)input->extension_factory_;
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,pcVar2,&zcis.cis_);
  ptr = (CodedInputStream *)CONCAT44(extraout_var,iVar1);
  if (ptr != (CodedInputStream *)0x0) {
    internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)&zcis.cis_,(char *)ptr);
    if ((int)ctx.super_EpsCopyInputStream.aliasing_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if ((int)ctx.super_EpsCopyInputStream.aliasing_ == 0) {
        internal::LogMessage::LogMessage
                  (&local_f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
                   ,0xf0);
        other = internal::LogMessage::operator<<(&local_f0,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&ctx.data_.factory + 7),other);
        internal::LogMessage::~LogMessage(&local_f0);
      }
      if (zcis.cis_ < ptr) {
        if (ctx.super_EpsCopyInputStream.buffer_end_ == (char *)0x0) {
          return false;
        }
        if ((long)ctx.super_EpsCopyInputStream.next_chunk_._4_4_ <
            (long)ptr - (long)ctx.super_EpsCopyInputStream.limit_end_) {
          return false;
        }
      }
      input->last_tag_ = (int)ctx.super_EpsCopyInputStream.aliasing_ + 1;
    }
    if ((parse_flags & kMergePartial) != kMerge) {
      return true;
    }
    iVar1 = (*this->_vptr_MessageLite[6])(this);
    if ((char)iVar1 != '\0') {
      return true;
    }
    LogInitializationErrorMessage(this);
  }
  return false;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}